

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void Node_fprint(FILE *stream,Node *node)

{
  char *__format;
  int iVar1;
  char *pcVar2;
  Node *pNVar3;
  
  if (node == (Node *)0x0) {
LAB_001047af:
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                  ,0x132,"void Node_fprint(FILE *, Node *)");
  }
LAB_0010477c:
  iVar1 = 0x21;
  switch(node->type) {
  case 1:
    pcVar2 = (node->rule).name;
    goto LAB_001048a3;
  default:
    fprintf((FILE *)stream,"\nunknown node type %d\n");
    exit(1);
  case 3:
    pcVar2 = *(char **)((node->rule).name + 0x18);
LAB_001048a3:
    __format = " %s";
    break;
  case 4:
    pcVar2 = " .";
    goto LAB_00104921;
  case 5:
    pcVar2 = (node->rule).name;
    __format = " \'%s\'";
    break;
  case 6:
    pcVar2 = (node->rule).name;
    __format = " \"%s\"";
    break;
  case 7:
    pcVar2 = (node->rule).name;
    __format = " [%s]";
    break;
  case 8:
    pcVar2 = (node->rule).name;
    __format = " { %s }";
    break;
  case 9:
    pcVar2 = (node->rule).name;
    __format = " ?{ %s }";
    break;
  case 10:
    pNVar3 = (node->name).rule;
    fwrite(" (",2,1,(FILE *)stream);
    Node_fprint(stream,pNVar3);
    for (pNVar3 = (pNVar3->rule).next; pNVar3 != (Node *)0x0; pNVar3 = (pNVar3->rule).next) {
      fwrite(" |",2,1,(FILE *)stream);
      Node_fprint(stream,pNVar3);
    }
    goto LAB_0010491a;
  case 0xb:
    pNVar3 = (node->name).rule;
    fwrite(" (",2,1,(FILE *)stream);
    do {
      Node_fprint(stream,pNVar3);
      pNVar3 = (pNVar3->rule).next;
    } while (pNVar3 != (Node *)0x0);
LAB_0010491a:
    pcVar2 = " )";
LAB_00104921:
    fwrite(pcVar2,2,1,(FILE *)stream);
    return;
  case 0xc:
    iVar1 = 0x26;
  case 0xd:
    goto switchD_00104797_caseD_d;
  case 0xe:
    Node_fprint(stream,(node->name).rule);
    iVar1 = 0x3f;
    goto LAB_0010483b;
  case 0xf:
    Node_fprint(stream,(node->name).rule);
    iVar1 = 0x2a;
    goto LAB_0010483b;
  case 0x10:
    Node_fprint(stream,(node->name).rule);
    iVar1 = 0x2b;
LAB_0010483b:
    fputc(iVar1,(FILE *)stream);
    return;
  }
  fprintf((FILE *)stream,__format,pcVar2);
  return;
switchD_00104797_caseD_d:
  fputc(iVar1,(FILE *)stream);
  node = (Node *)(node->rule).name;
  if (node == (Node *)0x0) goto LAB_001047af;
  goto LAB_0010477c;
}

Assistant:

static void Node_fprint(FILE *stream, Node *node)
{
  assert(node);
  switch (node->type)
    {
    case Rule:		fprintf(stream, " %s", node->rule.name);				break;
    case Name:		fprintf(stream, " %s", node->name.rule->rule.name);			break;
    case Dot:		fprintf(stream, " .");							break;
    case Character:	fprintf(stream, " '%s'", node->character.value);			break;
    case String:	fprintf(stream, " \"%s\"", node->string.value);				break;
    case Class:		fprintf(stream, " [%s]", node->cclass.value);				break;
    case Action:	fprintf(stream, " { %s }", node->action.text);				break;
    case Predicate:	fprintf(stream, " ?{ %s }", node->action.text);				break;

    case Alternate:	node= node->alternate.first;
			fprintf(stream, " (");
			Node_fprint(stream, node);
			while ((node= node->any.next))
			  {
			    fprintf(stream, " |");
			    Node_fprint(stream, node);
			  }
			fprintf(stream, " )");
			break;

    case Sequence:	node= node->sequence.first;
			fprintf(stream, " (");
			Node_fprint(stream, node);
			while ((node= node->any.next))
			  Node_fprint(stream, node);
			fprintf(stream, " )");
			break;

    case PeekFor:	fprintf(stream, "&");  Node_fprint(stream, node->query.element);	break;
    case PeekNot:	fprintf(stream, "!");  Node_fprint(stream, node->query.element);	break;
    case Query:		Node_fprint(stream, node->query.element);  fprintf(stream, "?");	break;
    case Star:		Node_fprint(stream, node->query.element);  fprintf(stream, "*");	break;
    case Plus:		Node_fprint(stream, node->query.element);  fprintf(stream, "+");	break;
    default:
      fprintf(stream, "\nunknown node type %d\n", node->type);
      exit(1);
    }
}